

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::scalarString(Output *this,StringRef *S,QuotingType MustQuote)

{
  Output *this_00;
  char cVar1;
  undefined1 in_R8B;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  size_t sVar6;
  StringRef s;
  StringRef s_00;
  StringRef s_01;
  StringRef s_02;
  StringRef s_03;
  StringRef s_04;
  StringRef Input;
  StringRef local_78;
  char *local_58;
  ulong local_50;
  Output *local_48;
  char *local_40;
  StringRef *local_38;
  size_t Index;
  
  newLineCheck(this);
  sVar6 = S->Length;
  local_38 = S;
  if (sVar6 == 0) {
    pcVar4 = "\'\'";
    sVar6 = 2;
  }
  else {
    if (MustQuote != None) {
      pcVar4 = "\"";
      if (MustQuote == Single) {
        pcVar4 = "\'";
      }
      s.Length = 1;
      s.Data = pcVar4;
      output(this,s);
      if (MustQuote == Double) {
        Input.Length = 0;
        Input.Data = (char *)local_38->Length;
        escape_abi_cxx11_((string *)&local_78,(yaml *)local_38->Data,Input,(bool)in_R8B);
        output(this,local_78);
        std::__cxx11::string::~string((string *)&local_78);
        s_00.Length = 1;
        s_00.Data = "\"";
        outputUpToEndOfLine(this,s_00);
        return;
      }
      local_40 = local_38->Data;
      local_50 = local_38->Length;
      uVar2 = local_50 & 0xffffffff;
      sVar6 = 0;
      uVar5 = 0;
      local_58 = pcVar4;
      local_48 = this;
      do {
        iVar3 = (int)sVar6 - uVar5;
        Index = sVar6;
        while( true ) {
          this = local_48;
          sVar6 = Index + 1;
          if (sVar6 - uVar2 == 1) {
            s_03.Data = local_40 + uVar5;
            s_03.Length._0_4_ = (int)local_50 - uVar5;
            s_03.Length._4_4_ = 0;
            output(local_48,s_03);
            sVar6 = 1;
            pcVar4 = local_58;
            goto LAB_00dcef7c;
          }
          cVar1 = StringRef::operator[](local_38,Index);
          this_00 = local_48;
          if (cVar1 == '\'') break;
          iVar3 = iVar3 + 1;
          Index = sVar6;
        }
        s_01.Length._0_4_ = iVar3;
        s_01.Data = local_40 + uVar5;
        s_01.Length._4_4_ = 0;
        output(local_48,s_01);
        s_02.Length = 2;
        s_02.Data = "\'\'";
        output(this_00,s_02);
        uVar5 = (uint)sVar6;
      } while( true );
    }
    pcVar4 = S->Data;
  }
LAB_00dcef7c:
  s_04.Length = sVar6;
  s_04.Data = pcVar4;
  outputUpToEndOfLine(this,s_04);
  return;
}

Assistant:

void Output::scalarString(StringRef &S, QuotingType MustQuote) {
  newLineCheck();
  if (S.empty()) {
    // Print '' for the empty string because leaving the field empty is not
    // allowed.
    outputUpToEndOfLine("''");
    return;
  }
  if (MustQuote == QuotingType::None) {
    // Only quote if we must.
    outputUpToEndOfLine(S);
    return;
  }

  const char *const Quote = MustQuote == QuotingType::Single ? "'" : "\"";
  output(Quote); // Starting quote.

  // When using double-quoted strings (and only in that case), non-printable characters may be
  // present, and will be escaped using a variety of unicode-scalar and special short-form
  // escapes. This is handled in yaml::escape.
  if (MustQuote == QuotingType::Double) {
    output(yaml::escape(S, /* EscapePrintable= */ false));
    outputUpToEndOfLine(Quote);
    return;
  }

  unsigned i = 0;
  unsigned j = 0;
  unsigned End = S.size();
  const char *Base = S.data();

  // When using single-quoted strings, any single quote ' must be doubled to be escaped.
  while (j < End) {
    if (S[j] == '\'') {                    // Escape quotes.
      output(StringRef(&Base[i], j - i));  // "flush".
      output(StringLiteral("''"));         // Print it as ''
      i = j + 1;
    }
    ++j;
  }
  output(StringRef(&Base[i], j - i));
  outputUpToEndOfLine(Quote); // Ending quote.
}